

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void negation_verify::NegationVerifyT<short>(void)

{
  short sVar1;
  ostream *poVar2;
  short out;
  bool result;
  short test;
  short minInt;
  undefined6 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbe;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffc0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  short t;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_20;
  short local_1e;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c;
  short local_a;
  short local_8;
  byte local_5;
  short local_4;
  short local_2;
  
  local_2 = std::numeric_limits<short>::min();
  local_4 = 2;
  local_5 = 0;
  local_8 = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_c,&local_2);
  local_a = (short)SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   ::operator-((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  local_8 = SafeInt::operator_cast_to_short(in_stack_ffffffffffffffc0);
  if ((local_5 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (1): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this = &local_20;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (this,&local_4);
  local_1e = (short)SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    ::operator-((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                 *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  sVar1 = SafeInt::operator_cast_to_short(this);
  t = (short)((ulong)this >> 0x30);
  local_8 = sVar1;
  if ((local_5 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (2): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_5 = SafeNegation<short>(t,(short *)CONCAT26(sVar1,in_stack_ffffffffffffffb8));
  if ((bool)local_5) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (1): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_5 = SafeNegation<short>(t,(short *)CONCAT26(sVar1,in_stack_ffffffffffffffb8));
  if (!(bool)local_5) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (2): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void NegationVerifyT()
    {
        T minInt = std::numeric_limits<T>::min();
        T test = 2;
        bool result = false;
        T out = 0;

        try
        {
            out = -SafeInt< T >(minInt);
        }
        catch (...)
        {
            result = true;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (1): " << std::endl;

        try
        {
            out = -SafeInt< T >(test);
        }
        catch (...)
        {
            result = false;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (2): " << std::endl;

        // Now try the non-throwing version

        result = SafeNegation(minInt, out);

        if (result != false)
            std::cerr << "Error in NegationVerifyT nothrow (1): " << std::endl;

        result = SafeNegation(test, out);

        if (result == false)
            std::cerr << "Error in NegationVerifyT nothrow (2): " << std::endl;
    }